

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

Abc_Ntk_t * Io_ReadBlif(char *pFileName,int fCheck)

{
  int iVar1;
  Extra_FileReader_t *pEVar2;
  Io_ReadBlif_t *p;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Abc_Ntk_t *pAVar9;
  Abc_Ntk_t *pNtk;
  long lVar10;
  Abc_Ntk_t *pNtk_00;
  
  pEVar2 = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t");
  if (pEVar2 == (Extra_FileReader_t *)0x0) {
    p = (Io_ReadBlif_t *)0x0;
  }
  else {
    p = (Io_ReadBlif_t *)malloc(0x488);
    memset(p,0,0x488);
    p->pFileName = pFileName;
    p->pReader = pEVar2;
    p->Output = _stdout;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    p->vNewTokens = pVVar3;
    pVVar5 = (Vec_Str_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    pcVar6 = (char *)malloc(100);
    pVVar5->pArray = pcVar6;
    p->vCubes = pVVar5;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    p->vInArrs = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    p->vOutReqs = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    p->vInDrives = pVVar7;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    p->vOutLoads = pVVar7;
  }
  if (p == (Io_ReadBlif_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pVVar3 = Io_ReadBlifGetTokens(p);
  p->vTokens = pVVar3;
  if ((pVVar3 != (Vec_Ptr_t *)0x0) && (iVar1 = strcmp((char *)*pVVar3->pArray,".model"), iVar1 == 0)
     ) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
    do {
      if ((p->vTokens == (Vec_Ptr_t *)0x0) ||
         (pAVar9 = Io_ReadBlifNetworkOne(p), pAVar9 == (Abc_Ntk_t *)0x0)) goto LAB_0032b1da;
      if ((p->vTokens != (Vec_Ptr_t *)0x0) &&
         (iVar1 = strcmp((char *)*p->vTokens->pArray,".exdc"), iVar1 == 0)) {
        pNtk = Io_ReadBlifNetworkOne(p);
        pAVar9->pExdc = pNtk;
        if (pNtk == (Abc_Ntk_t *)0x0) goto LAB_0032b1da;
        Abc_NtkFinalizeRead(pNtk);
      }
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        p->pNtkMaster = pAVar9;
        pNtk_00 = pAVar9;
      }
    } while( true );
  }
  p->LineCur = 0;
  builtin_strncpy(p->sError,"Wrong input file format.",0x19);
  Io_ReadBlifPrintErrorMessage(p);
  pNtk_00 = (Abc_Ntk_t *)0x0;
LAB_0032afab:
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Io_ReadBlifFree(p);
  }
  else {
    pcVar6 = Extra_UtilStrsav(pFileName);
    pNtk_00->pSpec = pcVar6;
    if (p->fHaveDefInArr != 0) {
      Abc_NtkTimeSetDefaultArrival(pNtk_00,p->DefInArrRise,p->DefInArrFall);
    }
    if (p->fHaveDefOutReq != 0) {
      Abc_NtkTimeSetDefaultRequired(pNtk_00,p->DefOutReqRise,p->DefOutReqFall);
    }
    if (p->fHaveDefInDri != 0) {
      Abc_NtkTimeSetDefaultInputDrive(pNtk_00,p->DefInDriRise,p->DefInDriFall);
    }
    if (p->fHaveDefOutLoad != 0) {
      Abc_NtkTimeSetDefaultOutputLoad(pNtk_00,p->DefOutLoadRise,p->DefOutLoadFall);
    }
    pVVar7 = p->vInArrs;
    if (2 < pVVar7->nSize) {
      lVar10 = 2;
      do {
        piVar8 = pVVar7->pArray;
        Abc_NtkTimeSetArrival
                  (pNtk_00,piVar8[lVar10 + -2],(float)piVar8[lVar10 + -1],(float)piVar8[lVar10]);
        pVVar7 = p->vInArrs;
        lVar10 = lVar10 + 3;
      } while ((int)lVar10 < pVVar7->nSize);
    }
    pVVar7 = p->vOutReqs;
    if (2 < pVVar7->nSize) {
      lVar10 = 2;
      do {
        piVar8 = pVVar7->pArray;
        Abc_NtkTimeSetRequired
                  (pNtk_00,piVar8[lVar10 + -2],(float)piVar8[lVar10 + -1],(float)piVar8[lVar10]);
        pVVar7 = p->vOutReqs;
        lVar10 = lVar10 + 3;
      } while ((int)lVar10 < pVVar7->nSize);
    }
    pVVar7 = p->vInDrives;
    if (2 < pVVar7->nSize) {
      lVar10 = 2;
      do {
        piVar8 = pVVar7->pArray;
        Abc_NtkTimeSetInputDrive
                  (pNtk_00,piVar8[lVar10 + -2],(float)piVar8[lVar10 + -1],(float)piVar8[lVar10]);
        pVVar7 = p->vInDrives;
        lVar10 = lVar10 + 3;
      } while ((int)lVar10 < pVVar7->nSize);
    }
    pVVar7 = p->vOutLoads;
    if (2 < pVVar7->nSize) {
      lVar10 = 2;
      do {
        piVar8 = pVVar7->pArray;
        Abc_NtkTimeSetOutputLoad
                  (pNtk_00,piVar8[lVar10 + -2],(float)piVar8[lVar10 + -1],(float)piVar8[lVar10]);
        pVVar7 = p->vOutLoads;
        lVar10 = lVar10 + 3;
      } while ((int)lVar10 < pVVar7->nSize);
    }
    Io_ReadBlifFree(p);
    if (fCheck == 0) {
      return pNtk_00;
    }
    iVar1 = Abc_NtkCheckRead(pNtk_00);
    if (iVar1 != 0) {
      return pNtk_00;
    }
    puts("Io_ReadBlif: The network check has failed.");
    Abc_NtkDelete(pNtk_00);
  }
  return (Abc_Ntk_t *)0x0;
LAB_0032b1da:
  if (p->fError == 0) {
    Abc_NtkFinalizeRead(pNtk_00);
  }
  goto LAB_0032afab;
}

Assistant:

Abc_Ntk_t * Io_ReadBlif( char * pFileName, int fCheck )
{
    Io_ReadBlif_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Io_ReadBlifFile( pFileName );
    if ( p == NULL )
        return NULL;

    // read the hierarchical network
    pNtk = Io_ReadBlifNetwork( p );
    if ( pNtk == NULL )
    {
        Io_ReadBlifFree( p );
        return NULL;
    }
    pNtk->pSpec = Extra_UtilStrsav( pFileName );
    Io_ReadBlifCreateTiming( p, pNtk );
    Io_ReadBlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadBlif: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}